

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

void HTS_Model_add_parameter
               (HTS_Model *model,size_t state_index,char *string,double *mean,double *vari,
               double *msd,double weight)

{
  float *pfVar1;
  long lVar2;
  long lVar3;
  size_t pdf_index;
  size_t tree_index;
  size_t local_40;
  size_t local_38;
  double local_30;
  
  lVar3 = model->vector_length * model->num_windows;
  local_30 = weight;
  HTS_Model_get_index(model,state_index,string,&local_38,&local_40);
  if (lVar3 != 0) {
    pfVar1 = model->pdf[local_38][local_40];
    lVar2 = 0;
    do {
      mean[lVar2] = (double)pfVar1[lVar2] * local_30 + mean[lVar2];
      vari[lVar2] = (double)pfVar1[lVar3 + lVar2] * local_30 + vari[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar3 - lVar2 != 0);
  }
  if ((msd != (double *)0x0) && (model->is_msd == '\x01')) {
    *msd = local_30 * (double)model->pdf[local_38][local_40][lVar3 * 2] + *msd;
  }
  return;
}

Assistant:

static void HTS_Model_add_parameter(HTS_Model * model, size_t state_index, const char *string, double *mean, double *vari, double *msd, double weight)
{
   size_t i;
   size_t tree_index, pdf_index;
   size_t len = model->vector_length * model->num_windows;

   HTS_Model_get_index(model, state_index, string, &tree_index, &pdf_index);
   for (i = 0; i < len; i++) {
      mean[i] += weight * model->pdf[tree_index][pdf_index][i];
      vari[i] += weight * model->pdf[tree_index][pdf_index][i + len];
   }
   if (msd != NULL && model->is_msd == TRUE)
      *msd += weight * model->pdf[tree_index][pdf_index][len + len];
}